

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::FindMSBCase::getInputValues(FindMSBCase *this,int numValues,void **values)

{
  pointer pSVar1;
  deUint32 dVar2;
  int in_R9D;
  Random rnd;
  deRandom local_30;
  
  dVar2 = deStringHash((this->super_IntegerFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_30,dVar2 ^ 0x742ac4e);
  pSVar1 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  anon_unknown_3::generateRandomInputData
            ((Random *)&local_30,(pSVar1->varType).m_data.basic.type,
             (pSVar1->varType).m_data.basic.precision,(Precision)*values,
             (deUint32 *)(ulong)(uint)numValues,in_R9D);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(getName()) ^ 0x742ac4e);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		deUint32*				inValue		= (deUint32*)values[0];

		generateRandomInputData(rnd, m_shaderType, type, precision, inValue, numValues);
	}